

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::LogicalType::LogicalType(LogicalType *this)

{
  _TimeUnit__isset *p_Var1;
  
  *(undefined ***)this = &PTR__LogicalType_0247d0b0;
  this->STRING = (StringType)&PTR__StringType_0247c960;
  this->MAP = (MapType)&PTR__MapType_0247ca30;
  this->LIST = (ListType)&PTR__ListType_0247ca98;
  this->ENUM = (EnumType)&PTR__EnumType_0247cb00;
  *(undefined ***)&this->DECIMAL = &PTR__DecimalType_0247cca0;
  (this->DECIMAL).scale = 0;
  (this->DECIMAL).precision = 0;
  this->DATE = (DateType)&PTR__DateType_0247cb68;
  *(undefined ***)&this->TIME = &PTR__TimeType_0247cf10;
  (this->TIME).isAdjustedToUTC = false;
  *(undefined ***)&(this->TIME).unit = &PTR__TimeUnit_0247ce40;
  (this->TIME).unit.MILLIS = (MilliSeconds)&PTR__MilliSeconds_0247cd08;
  (this->TIME).unit.MICROS = (MicroSeconds)&PTR__MicroSeconds_0247cd70;
  (this->TIME).unit.NANOS = (NanoSeconds)&PTR__NanoSeconds_0247cdd8;
  p_Var1 = &(this->TIME).unit.__isset;
  *p_Var1 = (_TimeUnit__isset)((byte)*p_Var1 & 0xf8);
  *(undefined ***)&this->TIMESTAMP = &PTR__TimestampType_0247cea8;
  (this->TIMESTAMP).isAdjustedToUTC = false;
  *(undefined ***)&(this->TIMESTAMP).unit = &PTR__TimeUnit_0247ce40;
  (this->TIMESTAMP).unit.MILLIS = (MilliSeconds)&PTR__MilliSeconds_0247cd08;
  (this->TIMESTAMP).unit.MICROS = (MicroSeconds)&PTR__MicroSeconds_0247cd70;
  (this->TIMESTAMP).unit.NANOS = (NanoSeconds)&PTR__NanoSeconds_0247cdd8;
  p_Var1 = &(this->TIMESTAMP).unit.__isset;
  *p_Var1 = (_TimeUnit__isset)((byte)*p_Var1 & 0xf8);
  *(undefined ***)&this->INTEGER = &PTR__IntType_0247cf78;
  (this->INTEGER).bitWidth = '\0';
  (this->INTEGER).isSigned = false;
  this->UNKNOWN = (NullType)&PTR__NullType_0247cc38;
  this->JSON = (JsonType)&PTR__JsonType_0247cfe0;
  this->BSON = (BsonType)&PTR__BsonType_0247d048;
  this->UUID = (UUIDType)&PTR__UUIDType_0247c9c8;
  this->FLOAT16 = (Float16Type)&PTR__Float16Type_0247cbd0;
  this->__isset = (_LogicalType__isset)((ushort)this->__isset & 0xc000);
  return;
}

Assistant:

LogicalType::LogicalType() noexcept {
}